

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHullComputer.cpp
# Opt level: O1

cbtVector3 __thiscall cbtConvexHullInternal::getBtNormal(cbtConvexHullInternal *this,Face *face)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar11 [56];
  undefined1 auVar10 [64];
  float fVar12;
  cbtVector3 cVar13;
  cbtVector3 cVar14;
  undefined1 auVar9 [64];
  
  auVar11 = in_ZMM1._8_56_;
  auVar6 = in_ZMM0._8_56_;
  cVar13 = toBtVector(this,&face->dir0);
  auVar9._0_8_ = cVar13.m_floats._8_8_;
  auVar9._8_56_ = auVar11;
  auVar4._0_8_ = cVar13.m_floats._0_8_;
  auVar4._8_56_ = auVar6;
  cVar14 = toBtVector(this,&face->dir1);
  auVar10._0_8_ = cVar14.m_floats._8_8_;
  auVar10._8_56_ = auVar11;
  auVar5._0_8_ = cVar14.m_floats._0_8_;
  auVar5._8_56_ = auVar6;
  auVar1 = vmovshdup_avx(auVar4._0_16_);
  auVar2 = vmovshdup_avx(auVar5._0_16_);
  auVar3 = vfmsub231ss_fma(ZEXT416((uint)(auVar2._0_4_ * cVar13.m_floats[2])),auVar1,auVar10._0_16_)
  ;
  auVar8 = vfmsub231ss_fma(ZEXT416((uint)(cVar14.m_floats[2] * cVar13.m_floats[0])),auVar5._0_16_,
                           auVar9._0_16_);
  fVar12 = auVar8._0_4_;
  auVar2 = vfmsub231ss_fma(ZEXT416((uint)(cVar14.m_floats[0] * auVar1._0_4_)),auVar4._0_16_,auVar2);
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar12)),auVar3,auVar3);
  auVar1 = vfmadd231ss_fma(auVar1,auVar2,auVar2);
  if (auVar1._0_4_ < 0.0) {
    fVar7 = sqrtf(auVar1._0_4_);
  }
  else {
    auVar1 = vsqrtss_avx(auVar1,auVar1);
    fVar7 = auVar1._0_4_;
  }
  fVar7 = 1.0 / fVar7;
  auVar1 = vinsertps_avx(ZEXT416((uint)(fVar7 * auVar3._0_4_)),ZEXT416((uint)(fVar7 * fVar12)),0x10)
  ;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
  auVar8._4_12_ = SUB1612(auVar3 << 0x40,4);
  auVar8._0_4_ = fVar7 * auVar2._0_4_;
  cVar13.m_floats._0_8_ = auVar1._0_8_;
  cVar13.m_floats._8_8_ = auVar8._0_8_;
  return (cbtVector3)cVar13.m_floats;
}

Assistant:

cbtVector3 cbtConvexHullInternal::getBtNormal(Face* face)
{
	return toBtVector(face->dir0).cross(toBtVector(face->dir1)).normalized();
}